

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
GetPropertyEquivalenceInfo
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this,
          PropertyRecord *propertyRecord,PropertyEquivalenceInfo *info)

{
  PropertyIndex slotIndex;
  bool bVar1;
  PropertyIndex PVar2;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord_local;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  
  local_30 = propertyRecord;
  bVar1 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_30,
                     (SimpleDictionaryPropertyDescriptor<unsigned_short> **)&propertyRecord_local);
  if ((bVar1) &&
     (((ulong)(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject & 0x800) == 0)) {
    slotIndex = *(PropertyIndex *)
                 ((long)&(propertyRecord_local->super_FinalizableObject).
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 2);
    PVar2 = DynamicTypeHandler::AdjustSlotIndexForInlineSlots
                      (&this->super_DynamicTypeHandler,slotIndex);
    info->slotIndex = PVar2;
    info->isAuxSlot = (this->super_DynamicTypeHandler).inlineSlotCapacity < slotIndex;
    info->isWritable =
         (bool)(*(byte *)((long)&(propertyRecord_local->super_FinalizableObject).
                                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1) >> 2
               & 1);
    bVar1 = PVar2 != 0xffff;
  }
  else {
    info->slotIndex = 0xffff;
    info->isAuxSlot = false;
    info->isWritable = false;
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if (propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            Js::PropertyIndex absSlotIndex = DisallowBigPropertyIndex(descriptor->propertyIndex);
            info.slotIndex = AdjustSlotIndexForInlineSlots(absSlotIndex);
            info.isAuxSlot = absSlotIndex > GetInlineSlotCapacity();
            info.isWritable = !!(descriptor->Attributes & PropertyWritable);
        }
        else
        {
            info.slotIndex = Constants::NoSlot;
            info.isAuxSlot = false;
            info.isWritable = false;
        }
        return info.slotIndex != Constants::NoSlot;
    }